

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lambda1.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  undefined1 local_30 [8];
  anon_class_16_2_947320ea f;
  int y;
  int x;
  char **argv_local;
  int argc_local;
  
  local_30._0_4_ = 0;
  f._0_8_ = &f.y;
  f.y._0_4_ = 0x4d;
  f.y._4_4_ = 0x4d;
  main::anon_class_16_2_947320ea::operator()((anon_class_16_2_947320ea *)local_30);
  main::anon_class_16_2_947320ea::operator()((anon_class_16_2_947320ea *)local_30);
  poVar1 = std::operator<<((ostream *)&std::cout,"Finally y: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(int)f.y);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{
	int x = 0;
	int y = 42;

	auto f = [x, &y] {
		cout << "x: " << x << endl;
		cout << "y: " << y << endl;
		++y;
	};

	// auto f = [x, &y]() mutable {
	// 	cout << "x: " << x << endl;
	// 	cout << "y: " << y << endl;
	// 	++x;
	// 	++y;
	// };

	x = y = 77;
	f();
	f();

	cout << "Finally y: " << y << endl;
	return 0;
}